

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  long *plVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  void *pvVar6;
  void *pvVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  int iVar17;
  int iVar18;
  int iVar19;
  parasail_result_t *ppVar20;
  __m128i *palVar21;
  __m128i *ptr;
  __m128i *palVar22;
  __m128i *ptr_00;
  __m128i *b;
  __m128i *ptr_01;
  __m128i *b_00;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int64_t *ptr_04;
  long lVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  size_t len;
  long lVar29;
  long lVar30;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar31;
  long lVar32;
  int iVar33;
  ulong size;
  ulong uVar34;
  long lVar35;
  long lVar36;
  int32_t segNum;
  long lVar37;
  uint uVar38;
  ulong uVar39;
  long lVar40;
  int iVar41;
  ulong uVar42;
  long lVar43;
  longlong lVar44;
  undefined4 uVar51;
  undefined1 auVar45 [12];
  undefined1 auVar46 [16];
  undefined1 extraout_XMM0 [16];
  long lVar52;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  long lVar53;
  int64_t iVar54;
  longlong lVar55;
  undefined4 uVar58;
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  longlong lVar59;
  undefined4 uVar62;
  undefined1 auVar60 [12];
  __m128i_64_t B_7;
  undefined1 auVar61 [16];
  undefined4 uVar63;
  long lVar64;
  undefined1 auVar66 [12];
  __m128i_64_t B_2;
  long lVar68;
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i_64_t B_1;
  long lVar78;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  __m128i_64_t B_8;
  undefined1 auVar82 [16];
  long lVar83;
  __m128i_64_t B_3;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  __m128i_64_t B_4;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  __m128i alVar95;
  __m128i alVar96;
  __m128i alVar97;
  __m128i alVar98;
  __m128i c;
  __m128i c_00;
  __m128i_64_t B;
  __m128i_64_t e;
  __m128i_64_t h;
  __m128i *local_1c0;
  __m128i *local_1a8;
  __m128i *local_1a0;
  __m128i *local_198;
  undefined1 local_138 [16];
  long lStack_80;
  ulong uStack_70;
  longlong local_58 [5];
  longlong extraout_RDX_00;
  longlong lVar65;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar4 = (profile->profile64).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar25 = profile->s1Len;
        if ((int)uVar25 < 1) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_64_cold_1();
        }
        else {
          iVar17 = uVar25 - 1;
          size = (ulong)uVar25 + 1 >> 1;
          iVar33 = (int)size;
          iVar18 = iVar17 / iVar33;
          uVar38 = iVar17 % iVar33;
          pvVar6 = (profile->profile64).matches;
          pvVar7 = (profile->profile64).similar;
          uVar27 = (ulong)(uint)open;
          iVar41 = -open;
          iVar26 = ppVar5->min;
          uVar28 = uVar27 | 0x8000000000000000;
          uVar39 = 0x8000000000000000 - (long)iVar26;
          if (iVar26 != iVar41 && SBORROW4(iVar26,iVar41) == iVar26 + open < 0) {
            uVar39 = uVar28;
          }
          iVar26 = ppVar5->max;
          ppVar20 = parasail_result_new_rowcol3((uint)((ulong)uVar25 + 1) & 0x7ffffffe,s2Len);
          if (ppVar20 != (parasail_result_t *)0x0) {
            ppVar20->flag = ppVar20->flag | 0x2850801;
            palVar21 = parasail_memalign___m128i(0x10,size);
            ptr = parasail_memalign___m128i(0x10,size);
            palVar22 = parasail_memalign___m128i(0x10,size);
            ptr_00 = parasail_memalign___m128i(0x10,size);
            b = parasail_memalign___m128i(0x10,size);
            ptr_01 = parasail_memalign___m128i(0x10,size);
            b_00 = parasail_memalign___m128i(0x10,size);
            ptr_02 = parasail_memalign___m128i(0x10,size);
            ptr_03 = parasail_memalign___m128i(0x10,size);
            b_01 = parasail_memalign___m128i(0x10,size);
            b_02 = parasail_memalign___m128i(0x10,size);
            b_03 = parasail_memalign___m128i(0x10,size);
            ptr_04 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
            alVar95[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
            alVar95[1]._0_1_ =
                 (b_02 == (__m128i *)0x0 ||
                 (b_01 == (__m128i *)0x0 || (ptr_03 == (__m128i *)0x0 || ptr_02 == (__m128i *)0x0)))
                 || ((b_00 == (__m128i *)0x0 || (ptr_01 == (__m128i *)0x0 || b == (__m128i *)0x0))
                    || ((ptr_00 == (__m128i *)0x0 || palVar22 == (__m128i *)0x0) ||
                       (ptr == (__m128i *)0x0 || palVar21 == (__m128i *)0x0)));
            len = CONCAT71((int7)(uVar28 >> 8),
                           (ptr_04 == (int64_t *)0x0 || b_03 == (__m128i *)0x0) || alVar95[1]._0_1_)
            ;
            if ((ptr_04 != (int64_t *)0x0 && b_03 != (__m128i *)0x0) &&
                ((b_02 != (__m128i *)0x0 &&
                 (b_01 != (__m128i *)0x0 && (ptr_03 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0)))
                && ((b_00 != (__m128i *)0x0 && (ptr_01 != (__m128i *)0x0 && b != (__m128i *)0x0)) &&
                   ((ptr_00 != (__m128i *)0x0 && palVar22 != (__m128i *)0x0) &&
                   (ptr != (__m128i *)0x0 && palVar21 != (__m128i *)0x0))))) {
              iVar19 = s2Len + -1;
              uVar42 = (ulong)(uint)gap;
              lVar23 = uVar39 + 1;
              lVar40 = 0x7ffffffffffffffe - (long)iVar26;
              auVar46._8_4_ = (int)lVar23;
              auVar46._0_8_ = lVar23;
              auVar46._12_4_ = (int)((ulong)lVar23 >> 0x20);
              local_138._8_4_ = (int)lVar40;
              local_138._0_8_ = lVar40;
              local_138._12_4_ = (int)((ulong)lVar40 >> 0x20);
              alVar95[0] = size;
              parasail_memset___m128i(palVar22,alVar95,len);
              alVar96[1] = extraout_RDX_00;
              alVar96[0] = size;
              parasail_memset___m128i(b,alVar96,len);
              alVar97[1] = extraout_RDX_01;
              alVar97[0] = size;
              parasail_memset___m128i(b_00,alVar97,len);
              alVar98[1] = extraout_RDX_02;
              alVar98[0] = size;
              parasail_memset___m128i(b_01,alVar98,len);
              c[1] = extraout_RDX_03;
              c[0] = size;
              parasail_memset___m128i(b_02,c,len);
              pmovsxbq(extraout_XMM0,0x101);
              c_00[1] = extraout_RDX_04;
              c_00[0] = size;
              parasail_memset___m128i(b_03,c_00,len);
              uVar28 = (ulong)(uint)gap;
              lVar29 = (long)iVar41;
              uVar34 = 0;
              do {
                lVar37 = 0;
                lVar36 = lVar29;
                do {
                  local_58[lVar37 + 2] = lVar36;
                  local_58[lVar37] = lVar36 - uVar27;
                  lVar37 = lVar37 + 1;
                  lVar36 = lVar36 - size * uVar28;
                } while (lVar37 == 1);
                palVar21[uVar34][0] = local_58[2];
                palVar21[uVar34][1] = local_58[3];
                ptr_03[uVar34][0] = local_58[0];
                ptr_03[uVar34][1] = local_58[1];
                uVar34 = uVar34 + 1;
                lVar29 = lVar29 - uVar28;
              } while (uVar34 != size);
              *ptr_04 = 0;
              lVar29 = (long)iVar41;
              uVar34 = 1;
              do {
                ptr_04[uVar34] = lVar29;
                uVar34 = uVar34 + 1;
                lVar29 = lVar29 - uVar28;
              } while (s2Len + 1 != uVar34);
              uVar25 = iVar33 - 1;
              uVar28 = 1;
              if (1 < s2Len) {
                uVar28 = (ulong)(uint)s2Len;
              }
              lVar29 = (ulong)(iVar33 + (uint)(iVar33 == 0)) << 4;
              uVar34 = 0;
              lStack_80 = auVar46._8_8_;
              do {
                local_198 = ptr_00;
                local_1a0 = ptr_01;
                local_1a8 = ptr_02;
                local_1c0 = ptr;
                ptr_02 = b_00;
                ptr_01 = b;
                ptr_00 = palVar22;
                ptr = palVar21;
                palVar22 = ptr + uVar25;
                lVar65 = ptr_00[uVar25][0];
                lVar59 = ptr_01[uVar25][0];
                lVar55 = ptr_02[uVar25][0];
                palVar21 = ptr + uVar25;
                auVar69._8_4_ = (int)(*palVar21)[0];
                auVar69._0_8_ = (*palVar21)[0];
                auVar69._12_4_ = *(undefined4 *)((long)*palVar21 + 4);
                lVar37 = 0;
                lVar31 = 0;
                lVar83 = 0;
                iVar54 = ptr_04[uVar34];
                lVar36 = auVar69._8_8_;
                lVar30 = (long)ppVar5->mapper[(byte)s2[uVar34]] * (long)iVar33 * 0x10;
                auVar69 = ZEXT816(0);
                lVar35 = 0;
                auVar74 = ZEXT816(0);
                auVar70 = _DAT_008d0e90;
                auVar80 = auVar46;
                do {
                  plVar3 = (long *)((long)*ptr_03 + lVar35);
                  lVar43 = *plVar3;
                  lVar52 = plVar3[1];
                  lVar64 = *(long *)((long)*ptr_03 + lVar35);
                  lVar68 = *(long *)((long)*ptr_03 + lVar35 + 8);
                  auVar61 = *(undefined1 (*) [16])((long)*b_01 + lVar35);
                  plVar3 = (long *)((long)pvVar4 + lVar35 + lVar30);
                  lVar53 = iVar54 + *plVar3;
                  lVar36 = lVar36 + plVar3[1];
                  if (lVar64 < lVar53) {
                    lVar64 = lVar53;
                  }
                  auVar82 = *(undefined1 (*) [16])((long)*b_02 + lVar35);
                  if (lVar68 < lVar36) {
                    lVar68 = lVar36;
                  }
                  lVar24 = auVar80._0_8_;
                  if (lVar64 <= lVar24) {
                    lVar64 = lVar24;
                  }
                  lVar78 = auVar80._8_8_;
                  auVar80 = *(undefined1 (*) [16])((long)*b_03 + lVar35);
                  if (lVar68 <= lVar78) {
                    lVar68 = lVar78;
                  }
                  plVar3 = (long *)((long)*local_1c0 + lVar35);
                  *plVar3 = lVar64;
                  plVar3[1] = lVar68;
                  auVar90._0_8_ = -(ulong)(lVar64 == lVar24);
                  auVar90._8_8_ = -(ulong)(lVar68 == lVar78);
                  auVar84 = blendvpd(auVar61,auVar74,auVar90);
                  plVar3 = (long *)((long)pvVar6 + lVar35 + lVar30);
                  auVar85._0_8_ = lVar37 + *plVar3;
                  auVar85._8_8_ = lVar65 + plVar3[1];
                  auVar76._0_8_ = -(ulong)(lVar53 == lVar64);
                  auVar76._8_8_ = -(ulong)(lVar36 == lVar68);
                  auVar85 = blendvpd(auVar84,auVar85,auVar76);
                  *(undefined1 (*) [16])((long)*local_198 + lVar35) = auVar85;
                  auVar84 = blendvpd(auVar82,auVar69,auVar90);
                  plVar3 = (long *)((long)pvVar7 + lVar35 + lVar30);
                  auVar89._0_8_ = lVar31 + *plVar3;
                  auVar89._8_8_ = lVar59 + plVar3[1];
                  auVar89 = blendvpd(auVar84,auVar89,auVar76);
                  auVar90 = blendvpd(auVar80,auVar70,auVar90);
                  auVar84._8_4_ = 0xffffffff;
                  auVar84._0_8_ = 0xffffffffffffffff;
                  auVar84._12_4_ = 0xffffffff;
                  auVar93._0_8_ = lVar83 + 1;
                  auVar93._8_8_ = lVar55 - auVar84._8_8_;
                  auVar84 = blendvpd(auVar90,auVar93,auVar76);
                  if (lVar64 <= (long)local_138._0_8_) {
                    local_138._0_8_ = lVar64;
                  }
                  if (lVar68 <= (long)local_138._8_8_) {
                    local_138._8_8_ = lVar68;
                  }
                  lVar36 = lVar64;
                  if (lVar64 < lVar23) {
                    lVar36 = lVar23;
                  }
                  lVar37 = lVar68;
                  if (lVar68 < lStack_80) {
                    lVar37 = lStack_80;
                  }
                  if (lVar36 <= auVar85._0_8_) {
                    lVar36 = auVar85._0_8_;
                  }
                  if (lVar37 <= auVar85._8_8_) {
                    lVar37 = auVar85._8_8_;
                  }
                  if (lVar36 <= auVar89._0_8_) {
                    lVar36 = auVar89._0_8_;
                  }
                  if (lVar37 <= auVar89._8_8_) {
                    lVar37 = auVar89._8_8_;
                  }
                  lVar31 = auVar84._0_8_;
                  lVar23 = lVar36;
                  if (lVar36 <= lVar31) {
                    lVar23 = lVar31;
                  }
                  lVar36 = auVar84._8_8_;
                  lStack_80 = lVar37;
                  if (lVar37 <= lVar36) {
                    lStack_80 = lVar36;
                  }
                  lVar64 = lVar64 - (ulong)(uint)open;
                  lVar68 = lVar68 - (ulong)(uint)open;
                  uStack_70 = (ulong)(uint)gap;
                  lVar43 = lVar43 - uVar42;
                  lVar52 = lVar52 - uStack_70;
                  lVar37 = lVar43;
                  if (lVar43 < lVar64) {
                    lVar37 = lVar64;
                  }
                  lVar83 = lVar52;
                  if (lVar52 < lVar68) {
                    lVar83 = lVar68;
                  }
                  lVar24 = lVar24 - uVar42;
                  lVar78 = lVar78 - uStack_70;
                  lVar53 = lVar24;
                  if (lVar24 < lVar64) {
                    lVar53 = lVar64;
                  }
                  lVar32 = lVar78;
                  if (lVar78 < lVar68) {
                    lVar32 = lVar68;
                  }
                  auVar47._8_8_ = -(ulong)(lVar52 < lVar68);
                  auVar47._0_8_ = -(ulong)(lVar43 < lVar64);
                  auVar76 = pblendvb(auVar61,auVar85,auVar47);
                  auVar82 = pblendvb(auVar82,auVar89,auVar47);
                  *(undefined1 (*) [16])((long)*local_1a0 + lVar35) = auVar89;
                  *(undefined1 (*) [16])((long)*local_1a8 + lVar35) = auVar84;
                  auVar87._8_4_ = 0xffffffff;
                  auVar87._0_8_ = 0xffffffffffffffff;
                  auVar87._12_4_ = 0xffffffff;
                  auVar79._0_8_ = auVar80._0_8_ + 1;
                  auVar79._8_8_ = auVar80._8_8_ - auVar87._8_8_;
                  auVar91._0_8_ = lVar31 + 1;
                  auVar91._8_8_ = lVar36 - auVar87._8_8_;
                  auVar94._8_4_ = 0xffffffff;
                  auVar94._0_8_ = 0xffffffffffffffff;
                  auVar94._12_4_ = 0xffffffff;
                  auVar80 = pblendvb(auVar79,auVar91,auVar47);
                  auVar61._8_8_ = -(ulong)(lVar78 < lVar68);
                  auVar61._0_8_ = -(ulong)(lVar24 < lVar64);
                  auVar74 = pblendvb(auVar74,auVar85,auVar61);
                  plVar3 = (long *)((long)*ptr_03 + lVar35);
                  *plVar3 = lVar37;
                  plVar3[1] = lVar83;
                  *(undefined1 (*) [16])((long)*b_01 + lVar35) = auVar76;
                  *(undefined1 (*) [16])((long)*b_02 + lVar35) = auVar82;
                  *(undefined1 (*) [16])((long)*b_03 + lVar35) = auVar80;
                  auVar80._8_8_ = lVar32;
                  auVar80._0_8_ = lVar53;
                  auVar69 = pblendvb(auVar69,auVar89,auVar61);
                  auVar82._0_8_ = auVar70._0_8_ + 1;
                  auVar82._8_8_ = auVar70._8_8_ - auVar94._8_8_;
                  auVar70 = pblendvb(auVar82,auVar91,auVar61);
                  plVar3 = (long *)((long)*ptr + lVar35);
                  iVar54 = *plVar3;
                  lVar36 = plVar3[1];
                  plVar3 = (long *)((long)*ptr_00 + lVar35);
                  lVar37 = *plVar3;
                  lVar65 = plVar3[1];
                  plVar3 = (long *)((long)*ptr_01 + lVar35);
                  lVar31 = *plVar3;
                  lVar59 = plVar3[1];
                  plVar3 = (long *)((long)*ptr_02 + lVar35);
                  lVar83 = *plVar3;
                  lVar55 = plVar3[1];
                  lVar35 = lVar35 + 0x10;
                } while (lVar29 != lVar35);
                iVar26 = 0;
                auVar92._8_4_ = 0xffffffff;
                auVar92._0_8_ = 0xffffffffffffffff;
                auVar92._12_4_ = 0xffffffff;
                do {
                  auVar57._8_4_ = (int)(*palVar22)[0];
                  auVar57._0_8_ = (*palVar22)[0];
                  auVar57._12_4_ = *(undefined4 *)((long)*palVar22 + 4);
                  auVar77._0_8_ = auVar80._0_8_;
                  auVar77._8_4_ = auVar80._0_4_;
                  auVar77._12_4_ = auVar80._4_4_;
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = auVar74._0_8_;
                  auVar74 = auVar9 << 0x40;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = auVar69._0_8_;
                  auVar69 = auVar10 << 0x40;
                  iVar54 = ptr_04[uVar34];
                  lVar36 = auVar57._8_8_;
                  auVar80._8_8_ = auVar77._8_8_;
                  auVar80._0_8_ = ptr_04[uVar34 + 1] - uVar27;
                  auVar71._0_8_ = auVar70._0_8_;
                  auVar71._8_4_ = auVar70._0_4_;
                  auVar71._12_4_ = auVar70._4_4_;
                  auVar70._8_8_ = auVar71._8_8_;
                  auVar70._0_8_ = 1;
                  lVar37 = 0;
                  do {
                    plVar3 = (long *)((long)pvVar4 + lVar37 + lVar30);
                    iVar54 = iVar54 + *plVar3;
                    lVar36 = lVar36 + plVar3[1];
                    lVar35 = auVar80._0_8_;
                    lVar31 = *(long *)((long)*local_1c0 + lVar37);
                    lVar83 = lVar35;
                    if (lVar35 < lVar31) {
                      lVar83 = lVar31;
                    }
                    lVar31 = *(long *)((long)*local_1c0 + lVar37 + 8);
                    lVar68 = auVar80._8_8_;
                    lVar64 = lVar68;
                    if (lVar68 < lVar31) {
                      lVar64 = lVar31;
                    }
                    plVar3 = (long *)((long)*local_1c0 + lVar37);
                    *plVar3 = lVar83;
                    plVar3[1] = lVar64;
                    auVar49._0_8_ = -(ulong)(lVar83 == lVar35);
                    auVar49._8_8_ = -(ulong)(lVar64 == lVar68);
                    auVar48._0_8_ = -(ulong)(lVar83 == iVar54);
                    auVar48._8_8_ = -(ulong)(lVar64 == lVar36);
                    auVar49 = ~auVar48 & auVar49;
                    auVar61 = blendvpd(*(undefined1 (*) [16])((long)*local_198 + lVar37),auVar74,
                                       auVar49);
                    *(undefined1 (*) [16])((long)*local_198 + lVar37) = auVar61;
                    auVar84 = blendvpd(*(undefined1 (*) [16])((long)*local_1a0 + lVar37),auVar69,
                                       auVar49);
                    *(undefined1 (*) [16])((long)*local_1a0 + lVar37) = auVar84;
                    auVar82 = blendvpd(*(undefined1 (*) [16])((long)*local_1a8 + lVar37),auVar70,
                                       auVar49);
                    if (lVar83 <= (long)local_138._0_8_) {
                      local_138._0_8_ = lVar83;
                    }
                    if (lVar64 <= (long)local_138._8_8_) {
                      local_138._8_8_ = lVar64;
                    }
                    lVar31 = lVar83;
                    if (lVar83 < lVar23) {
                      lVar31 = lVar23;
                    }
                    lVar43 = lVar64;
                    if (lVar64 < lStack_80) {
                      lVar43 = lStack_80;
                    }
                    if (lVar31 <= auVar61._0_8_) {
                      lVar31 = auVar61._0_8_;
                    }
                    if (lVar43 <= auVar61._8_8_) {
                      lVar43 = auVar61._8_8_;
                    }
                    if (lVar31 <= auVar84._0_8_) {
                      lVar31 = auVar84._0_8_;
                    }
                    if (lVar43 <= auVar84._8_8_) {
                      lVar43 = auVar84._8_8_;
                    }
                    lVar52 = auVar82._0_8_;
                    lVar23 = lVar31;
                    if (lVar31 <= lVar52) {
                      lVar23 = lVar52;
                    }
                    lVar31 = auVar82._8_8_;
                    lStack_80 = lVar43;
                    if (lVar43 <= lVar31) {
                      lStack_80 = lVar31;
                    }
                    lVar83 = lVar83 - (ulong)(uint)open;
                    lVar64 = lVar64 - (ulong)(uint)open;
                    auVar81._0_8_ = lVar35 - uVar42;
                    auVar81._8_8_ = lVar68 - uStack_70;
                    *(undefined1 (*) [16])((long)*local_1a8 + lVar37) = auVar82;
                    auVar88._8_8_ = -(ulong)(lVar64 < auVar81._8_8_);
                    auVar88._0_8_ = -(ulong)(lVar83 < auVar81._0_8_);
                    auVar86._0_8_ = -(ulong)(lVar83 == auVar81._0_8_);
                    auVar86._8_8_ = -(ulong)(lVar64 == auVar81._8_8_);
                    auVar86 = auVar86 | auVar88;
                    if ((((((((((((((((auVar86 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar86 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar86 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar86 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar86 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar86 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar86 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar86 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar86 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar86 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar86 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar86 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar86[0xf]) {
                      iVar41 = 0x27;
                    }
                    else {
                      auVar50._8_8_ = -(ulong)(auVar81._8_8_ < lVar64);
                      auVar50._0_8_ = -(ulong)(auVar81._0_8_ < lVar83);
                      auVar74 = pblendvb(auVar74,auVar61,auVar50);
                      auVar69 = pblendvb(auVar69,auVar84,auVar50);
                      auVar72._0_8_ = auVar70._0_8_ + 1;
                      auVar72._8_8_ = auVar70._8_8_ - auVar92._8_8_;
                      auVar67._0_8_ = lVar52 + 1;
                      auVar67._8_8_ = lVar31 - auVar92._8_8_;
                      auVar70 = pblendvb(auVar72,auVar67,auVar50);
                      plVar3 = (long *)((long)*ptr + lVar37);
                      iVar54 = *plVar3;
                      lVar36 = plVar3[1];
                      iVar41 = 0;
                      auVar80 = auVar81;
                    }
                    if ((((((((((((((((auVar86 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar86 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar86 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar86 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar86 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar86 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar86 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar86 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar86 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar86 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar86 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar86 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar86 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar86 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar86 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar86[0xf]) goto LAB_00712606;
                    lVar37 = lVar37 + 0x10;
                  } while (lVar29 != lVar37);
                  iVar41 = 0;
LAB_00712606:
                  bVar8 = iVar26 == 0;
                  iVar26 = iVar26 + 1;
                } while (iVar41 == 0 && bVar8);
                lVar65 = local_1c0[uVar38][0];
                uVar63 = (undefined4)local_1c0[uVar38][1];
                lVar59 = local_198[uVar38][0];
                uVar62 = (undefined4)local_198[uVar38][1];
                lVar55 = local_1a0[uVar38][0];
                uVar58 = (undefined4)local_1a0[uVar38][1];
                lVar44 = local_1a8[uVar38][0];
                uVar51 = (undefined4)local_1a8[uVar38][1];
                if (iVar18 < 1) {
                  do {
                    uVar51 = (undefined4)lVar44;
                    uVar58 = (undefined4)lVar55;
                    uVar62 = (undefined4)lVar59;
                    uVar63 = (undefined4)lVar65;
                    lVar65 = 0;
                    lVar59 = 0;
                    lVar55 = 0;
                    lVar44 = 0;
                  } while (iVar18 < 0);
                }
                *(undefined4 *)(*((ppVar20->field_4).trace)->trace_del_table + uVar34 * 4) = uVar63;
                *(undefined4 *)
                 (*(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 8) + uVar34 * 4) =
                     uVar62;
                *(undefined4 *)
                 (*(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x10) + uVar34 * 4)
                     = uVar58;
                *(undefined4 *)
                 (*(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x18) + uVar34 * 4)
                     = uVar51;
                uVar34 = uVar34 + 1;
                palVar21 = local_1c0;
                palVar22 = local_198;
                b = local_1a0;
                b_00 = local_1a8;
                if (uVar34 == uVar28) {
                  lVar36 = size * 4;
                  lVar29 = 0;
                  do {
                    puVar1 = (undefined4 *)((long)*local_1c0 + lVar29 * 4);
                    uVar63 = puVar1[2];
                    puVar2 = (undefined4 *)((long)*local_198 + lVar29 * 4);
                    uVar62 = *puVar2;
                    uVar58 = puVar2[2];
                    puVar2 = (undefined4 *)((long)*local_1a0 + lVar29 * 4);
                    uVar51 = *puVar2;
                    uVar13 = puVar2[2];
                    puVar2 = (undefined4 *)((long)*local_1a8 + lVar29 * 4);
                    uVar14 = *puVar2;
                    uVar15 = puVar2[2];
                    lVar37 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x20);
                    *(undefined4 *)(lVar37 + lVar29) = *puVar1;
                    *(undefined4 *)(lVar36 + lVar37 + lVar29) = uVar63;
                    lVar37 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x28);
                    *(undefined4 *)(lVar37 + lVar29) = uVar62;
                    *(undefined4 *)(lVar36 + lVar37 + lVar29) = uVar58;
                    lVar37 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x30);
                    *(undefined4 *)(lVar37 + lVar29) = uVar51;
                    *(undefined4 *)(lVar36 + lVar37 + lVar29) = uVar13;
                    lVar37 = *(long *)((long)((ppVar20->field_4).trace)->trace_del_table + 0x38);
                    *(undefined4 *)(lVar37 + lVar29) = uVar14;
                    *(undefined4 *)(lVar36 + lVar37 + lVar29) = uVar15;
                    lVar29 = lVar29 + 4;
                  } while ((ulong)(iVar33 + (uint)(iVar33 == 0)) << 2 != lVar29);
                  alVar95 = local_1c0[uVar38];
                  auVar66 = alVar95._0_12_;
                  alVar96 = local_198[uVar38];
                  auVar60 = alVar96._0_12_;
                  alVar97 = local_1a0[uVar38];
                  auVar56 = alVar97._0_12_;
                  alVar98 = local_1a8[uVar38];
                  auVar45 = alVar98._0_12_;
                  if (iVar18 < 1) {
                    do {
                      auVar74._8_8_ = 0;
                      auVar74._0_8_ = alVar95[0];
                      alVar95 = (__m128i)(auVar74 << 0x40);
                      auVar66 = alVar95._0_12_;
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = alVar96[0];
                      alVar96 = (__m128i)(auVar11 << 0x40);
                      auVar60 = alVar96._0_12_;
                      auVar12._8_8_ = 0;
                      auVar12._0_8_ = alVar97[0];
                      alVar97 = (__m128i)(auVar12 << 0x40);
                      auVar56 = alVar97._0_12_;
                      auVar16._8_8_ = 0;
                      auVar16._0_8_ = alVar98[0];
                      alVar98 = (__m128i)(auVar16 << 0x40);
                      auVar45 = alVar98._0_12_;
                    } while (iVar18 < 0);
                  }
                  auVar73._8_8_ = -(ulong)((long)local_138._8_8_ <= (long)uVar39);
                  auVar73._0_8_ = -(ulong)((long)local_138._0_8_ <= (long)uVar39);
                  auVar75._8_8_ = -(ulong)(lVar40 < lStack_80);
                  auVar75._0_8_ = -(ulong)(lVar40 < lVar23);
                  auVar75 = auVar75 | auVar73;
                  if ((((((((((((((((auVar75 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                   && (auVar75 >> 0xf & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                  (auVar75 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar75 >> 0x1f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar75 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar75 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar75 >> 0x37 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar75 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar75 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar75 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar75 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar75 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar75 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar75 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar75 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar75[0xf]) {
                    iVar26 = auVar66._8_4_;
                    iVar18 = auVar60._8_4_;
                    iVar33 = auVar56._8_4_;
                    iVar41 = auVar45._8_4_;
                  }
                  else {
                    *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
                    iVar26 = 0;
                    iVar18 = 0;
                    iVar33 = 0;
                    iVar41 = 0;
                    iVar19 = 0;
                    iVar17 = 0;
                  }
                  ppVar20->score = iVar26;
                  ppVar20->end_query = iVar17;
                  ppVar20->end_ref = iVar19;
                  ((ppVar20->field_4).stats)->matches = iVar18;
                  ((ppVar20->field_4).stats)->similar = iVar33;
                  ((ppVar20->field_4).stats)->length = iVar41;
                  parasail_free(ptr_04);
                  parasail_free(b_03);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(local_1a8);
                  parasail_free(ptr_01);
                  parasail_free(local_1a0);
                  parasail_free(ptr_00);
                  parasail_free(local_198);
                  parasail_free(ptr);
                  parasail_free(local_1c0);
                  return ppVar20;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile64.score;
    vProfileM = (__m128i*)profile->profile64.matches;
    vProfileS = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            __m128i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);
        vHM = _mm_slli_si128(vHM, 8);
        vHS = _mm_slli_si128(vHS, 8);
        vHL = _mm_slli_si128(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi64_rpl(vH_dag, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi64(vH, vH_dag);
            case2 = _mm_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_add_epi64(vEL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vFL, vOne),
                    _mm_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 8);
            vF = _mm_slli_si128(vF, 8);
            vFM = _mm_slli_si128(vFM, 8);
            vFS = _mm_slli_si128(vFS, 8);
            vFL = _mm_slli_si128(vFL, 8);
            vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_add_epi64(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi64(vH, vHp);
                case2 = _mm_cmpeq_epi64(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_sub_epi64(vH, vGapO);
                vF_ext = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi64_rpl(vF_ext, vEF_opn),
                                _mm_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi64_rpl(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_add_epi64(vFL, vOne),
                        _mm_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 8);
                vHM = _mm_slli_si128 (vHM, 8);
                vHS = _mm_slli_si128 (vHS, 8);
                vHL = _mm_slli_si128 (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 8);
            vHM = _mm_slli_si128 (vHM, 8);
            vHS = _mm_slli_si128 (vHS, 8);
            vHL = _mm_slli_si128 (vHL, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}